

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Write.cpp
# Opt level: O0

error<idx2::idx2_err_code> idx2::FlushChunks(idx2_file *Idx2,encode_data *E)

{
  undefined1 auVar1 [11];
  int iVar2;
  byte *pbVar3;
  size_t sVar4;
  hash_table<unsigned_int,_idx2::channel> *Ht;
  hash_table<unsigned_int,_idx2::channel> *extraout_RDX;
  hash_table<unsigned_int,_idx2::channel> *Ht_00;
  hash_table<unsigned_long,_idx2::chunk_meta_info> *phVar5;
  hash_table<unsigned_long,_idx2::chunk_meta_info> *extraout_RDX_00;
  stref sVar6;
  error<idx2::idx2_err_code> eVar7;
  double local_4f0;
  double local_4e8;
  double local_4c8;
  double local_4c0;
  double local_458;
  double local_450;
  anon_class_1_0_00000001 local_3c1;
  void *local_3c0;
  size_t local_3b8;
  undefined8 local_3b0;
  buffer local_3a8;
  void *local_390;
  size_t local_388;
  undefined8 local_380;
  anon_union_8_2_2df48d06_for_stref_0 local_378;
  int local_370;
  anon_union_8_2_2df48d06_for_stref_0 local_358;
  undefined4 local_350;
  anon_union_8_2_2df48d06_for_stref_0 local_348;
  int local_340;
  undefined1 local_338 [8];
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Write_cpp:369:5)>
  __ScopeGuard__369;
  anon_class_8_1_3fcf61a8_for_Func __CleanUpFunc__369;
  FILE *Fp;
  anon_union_8_2_2df48d06_for_stref_0 local_310;
  u64 local_308;
  anon_union_8_2_2df48d06_for_stref_0 local_300;
  file_id FileId;
  chunk_meta_info *Cm;
  chunk_meta_info *local_2d0;
  hash_table<unsigned_long,_idx2::chunk_meta_info> *local_2c8;
  undefined1 local_2c0 [8];
  iterator CmIt;
  i16 BitPlane;
  i8 Subband;
  uint *puStack_298;
  i8 Level;
  t2<unsigned_int,_idx2::channel_*> *Ch_1;
  uint *local_288;
  iterator local_280;
  undefined1 local_260 [8];
  iterator Ch;
  encode_data *E_local;
  idx2_file *Idx2_local;
  undefined5 uStack_225;
  int BytePos;
  double local_210;
  double *local_208;
  double local_200;
  double *local_1f8;
  double local_1f0;
  double *local_1e8;
  long *local_1e0;
  undefined8 *local_1d8;
  undefined8 *local_1d0;
  long *local_1c8;
  long *local_1c0;
  long *local_1b8;
  long *local_1b0;
  long *local_1a8;
  anon_union_8_2_2df48d06_for_stref_0 local_1a0;
  anon_union_8_2_2df48d06_for_stref_0 *local_198;
  void **local_190;
  FILE **local_188;
  void **local_180;
  FILE **local_178;
  void **local_170;
  void **local_168;
  u64 local_160;
  u64 local_158;
  i64 local_150;
  array<idx2::t2<unsigned_int,_idx2::channel_*>_> *local_148;
  hash_table<unsigned_int,_idx2::channel> *local_140;
  long local_138;
  iterator *local_130;
  undefined1 *local_128;
  t2<unsigned_int,_idx2::channel_*> **local_120;
  array<idx2::t2<unsigned_int,_idx2::channel_*>_> *local_118;
  undefined1 *local_110;
  undefined8 *local_108;
  undefined8 *local_100;
  long *local_f8;
  long *local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  chunk_meta_info **local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  double *local_b8;
  double *local_b0;
  double *local_a8;
  double *local_a0;
  double *local_98;
  double *local_90;
  double *local_88;
  double *local_80;
  double *local_78;
  double *local_70;
  double *local_68;
  double *local_60;
  undefined8 local_58;
  size_t local_50;
  void *local_48;
  void **local_40;
  undefined8 local_38;
  size_t local_30;
  void *local_28;
  void **local_20;
  long local_18;
  array<idx2::t2<unsigned_int,_idx2::channel_*>_> *local_10;
  
  local_148 = &E->SortedChannels;
  local_140 = &E->Channels;
  local_150 = (E->Channels).Size;
  Ch.Idx = (i64)E;
  GrowCapacity<idx2::t2<unsigned_int,idx2::channel*>>(local_148,local_150);
  local_138 = Ch.Idx + 0x340;
  *(undefined8 *)(Ch.Idx + 0x358) = 0;
  Begin<unsigned_int,idx2::channel>((iterator *)local_260,(idx2 *)(Ch.Idx + 0x38),Ht);
  Ht_00 = extraout_RDX;
  while( true ) {
    End<unsigned_int,idx2::channel>(&local_280,(idx2 *)(Ch.Idx + 0x38),Ht_00);
    local_128 = local_260;
    local_130 = &local_280;
    if (Ch.Val == (channel *)local_280.Ht &&
        Ch.Ht == (hash_table<unsigned_int,_idx2::channel> *)local_280.Idx) break;
    local_118 = (array<idx2::t2<unsigned_int,_idx2::channel_*>_> *)(Ch.Idx + 0x340);
    Ch_1._0_4_ = *(uint *)local_260;
    local_288 = Ch.Key;
    local_120 = &Ch_1;
    if (*(long *)(Ch.Idx + 0x360) <= *(long *)(Ch.Idx + 0x358)) {
      GrowCapacity<idx2::t2<unsigned_int,idx2::channel*>>(local_118,0);
    }
    local_18 = local_118->Size;
    local_118->Size = local_18 + 1;
    local_10 = local_118;
    pbVar3 = (local_118->Buffer).Data + local_18 * 0x10;
    *(t2<unsigned_int,_idx2::channel_*> **)pbVar3 = *local_120;
    *(t2<unsigned_int,_idx2::channel_*> **)(pbVar3 + 8) = local_120[1];
    local_110 = local_260;
    do {
      Ch.Ht = (hash_table<unsigned_int,_idx2::channel> *)((long)&(Ch.Ht)->Keys + 1);
    } while (*(char *)((long)&(Ch.Ht)->Keys +
                      (long)&(((Ch.Val)->BrickDeltasStream).Stream.Alloc)->_vptr_allocator) !=
             '\x02');
    local_260 = (undefined1  [8])(((Ch.Val)->BrickDeltasStream).Stream.Data + (long)Ch.Ht * 4);
    Ht_00 = (hash_table<unsigned_int,_idx2::channel> *)((long)Ch.Ht * 0xd8);
    Ch.Key = (uint *)((long)&Ht_00->Keys + ((Ch.Val)->BrickDeltasStream).Stream.Bytes);
  }
  local_100 = (undefined8 *)(Ch.Idx + 0x340);
  local_f0 = (long *)(Ch.Idx + 0x340);
  InsertionSort<idx2::t2<unsigned_int,idx2::channel*>*>
            ((t2<unsigned_int,_idx2::channel_*> *)*local_100,
             (t2<unsigned_int,_idx2::channel_*> *)(*local_f0 + *(long *)(Ch.Idx + 0x358) * 0x10));
  local_108 = (undefined8 *)(Ch.Idx + 0x340);
  puStack_298 = (uint *)*local_108;
  while( true ) {
    local_f8 = (long *)(Ch.Idx + 0x340);
    phVar5 = (hash_table<unsigned_long,_idx2::chunk_meta_info> *)(*(long *)(Ch.Idx + 0x358) * 0x10);
    if (puStack_298 == (uint *)((long)&phVar5->Keys + *local_f8)) break;
    local_e8 = (ulong)*puStack_298;
    CmIt.Idx._7_1_ = (byte)*puStack_298 & 0xf;
    local_e0 = (ulong)*puStack_298;
    CmIt.Idx._6_1_ = (i8)(*puStack_298 >> 4);
    local_d8 = (ulong)*puStack_298;
    CmIt.Idx._4_2_ = (i16)(*puStack_298 >> 0x10);
    WriteChunk(Idx2,(encode_data *)Ch.Idx,*(channel **)(puStack_298 + 2),CmIt.Idx._7_1_,
               CmIt.Idx._6_1_,CmIt.Idx._4_2_);
    puStack_298 = puStack_298 + 4;
  }
  Begin<unsigned_long,idx2::chunk_meta_info>((iterator *)local_2c0,(idx2 *)(Ch.Idx + 0x1f0),phVar5);
  phVar5 = extraout_RDX_00;
  while( true ) {
    End<unsigned_long,idx2::chunk_meta_info>((iterator *)&Cm,(idx2 *)(Ch.Idx + 0x1f0),phVar5);
    local_c8 = local_2c0;
    local_d0 = &Cm;
    if (CmIt.Val == local_2d0 && CmIt.Ht == local_2c8) break;
    FileId.Id = (u64)CmIt.Key;
    ConstructFilePath((file_id *)&local_300,Idx2,*(u64 *)local_2c0);
    if (FileId.Name._8_8_ != *(u64 *)local_2c0) {
      ConstructFilePath((file_id *)&Fp,Idx2,*(u64 *)local_2c0);
      local_300.Ptr = (str)Fp;
      FileId.Name.field_0 = local_310;
      FileId.Name._8_8_ = local_308;
    }
    __CleanUpFunc__369.Fp = (FILE **)fopen(local_300.Ptr,"ab");
    __ScopeGuard__369._8_8_ = &__CleanUpFunc__369;
    scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Write.cpp:369:5)>
    ::scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Write_cpp:369:5)>
                   *)local_338,(anon_class_8_1_3fcf61a8_for_Func *)&__ScopeGuard__369.Dismissed);
    if (__CleanUpFunc__369.Fp == (FILE **)0x0) {
      local_198 = &local_358;
      local_1a0.Ptr = local_300.Ptr;
      local_358.Ptr = local_300.Ptr;
      sVar4 = strlen(local_300.Ptr);
      local_350 = (undefined4)sVar4;
      sVar6 = GetParentPath((stref *)&local_358);
      local_378 = sVar6.field_0;
      local_370 = sVar6.Size;
      local_348 = local_378;
      local_340 = local_370;
      CreateFullDir((stref *)&local_348);
      __CleanUpFunc__369.Fp = (FILE **)fopen(local_300.Ptr,"ab");
    }
    **(undefined8 **)(FileId.Id + 0x48) = *(undefined8 *)(FileId.Id + 0x50);
    iVar2 = *(int *)(FileId.Id + 0x58) >> 3;
    if (0 < iVar2) {
      *(ulong *)(FileId.Id + 0x50) =
           (*(ulong *)(FileId.Id + 0x50) >> 1) >> ((char)(iVar2 << 3) - 1U & 0x3f);
    }
    *(long *)(FileId.Id + 0x48) = *(long *)(FileId.Id + 0x48) + (long)iVar2;
    *(uint *)(FileId.Id + 0x58) = *(uint *)(FileId.Id + 0x58) & 7;
    local_1b0 = (long *)(FileId.Id + 0x30);
    local_48 = (void *)*local_1b0;
    local_50 = (*(long *)(FileId.Id + 0x48) - *local_1b0) +
               (long)((*(int *)(FileId.Id + 0x58) + 7) / 8);
    local_58 = *(undefined8 *)(FileId.Id + 0x40);
    local_40 = &local_390;
    local_178 = __CleanUpFunc__369.Fp;
    local_180 = &local_390;
    local_1a8 = local_1b0;
    local_170 = local_180;
    local_390 = local_48;
    local_388 = local_50;
    local_380 = local_58;
    fwrite(local_48,local_50,1,(FILE *)__CleanUpFunc__369.Fp);
    local_1c8 = (long *)(FileId.Id + 0x30);
    local_1f0 = (double)((*(long *)(FileId.Id + 0x48) - *local_1c8) +
                        (long)((*(int *)(FileId.Id + 0x58) + 7) / 8));
    local_1e8 = &ChunkSizesStat;
    local_b0 = &ChunkSizesStat;
    local_b8 = &local_1f0;
    local_450 = local_1f0;
    if (ChunkSizesStat <= local_1f0) {
      local_450 = ChunkSizesStat;
    }
    ChunkSizesStat = local_450;
    local_80 = &DAT_003005a8;
    local_88 = &local_1f0;
    local_458 = local_1f0;
    if (local_1f0 <= DAT_003005a8) {
      local_458 = DAT_003005a8;
    }
    DAT_003005a8 = local_458;
    DAT_003005b0 = local_1f0 + DAT_003005b0;
    DAT_003005b8 = DAT_003005b8 + 1;
    DAT_003005c0 = local_1f0 * local_1f0 + DAT_003005c0;
    local_1d0 = (undefined8 *)(FileId.Id + 0x30);
    WritePOD<int>((FILE *)__CleanUpFunc__369.Fp,
                  ((int)*(undefined8 *)(FileId.Id + 0x48) - (int)*local_1d0) +
                  (*(int *)(FileId.Id + 0x58) + 7) / 8);
    ToBuffer<unsigned_long>(&local_3a8,(array<unsigned_long> *)FileId.Id);
    CompressBufZstd(&local_3a8,(bitstream *)(Ch.Idx + 0x250));
    local_1c0 = (long *)(Ch.Idx + 0x250);
    local_28 = (void *)*local_1c0;
    local_30 = (*(long *)(Ch.Idx + 0x268) - *local_1c0) + (long)((*(int *)(Ch.Idx + 0x278) + 7) / 8)
    ;
    local_38 = *(undefined8 *)(Ch.Idx + 0x260);
    local_20 = &local_3c0;
    local_188 = __CleanUpFunc__369.Fp;
    local_190 = &local_3c0;
    local_1b8 = local_1c0;
    local_168 = local_190;
    local_3c0 = local_28;
    local_3b8 = local_30;
    local_3b0 = local_38;
    fwrite(local_28,local_30,1,(FILE *)__CleanUpFunc__369.Fp);
    local_1d8 = (undefined8 *)(Ch.Idx + 0x250);
    WritePOD<int>((FILE *)__CleanUpFunc__369.Fp,
                  ((int)*(undefined8 *)(Ch.Idx + 0x268) - (int)*local_1d8) +
                  (*(int *)(Ch.Idx + 0x278) + 7) / 8);
    local_158 = FileId.Id;
    WritePOD<int>((FILE *)__CleanUpFunc__369.Fp,(int)*(undefined8 *)(FileId.Id + 0x18));
    local_160 = FileId.Id;
    local_200 = (double)*(long *)(FileId.Id + 0x18) * 8.0;
    local_1f8 = &UncompressedChunkAddressesStat;
    local_a0 = &UncompressedChunkAddressesStat;
    local_a8 = &local_200;
    local_4c0 = local_200;
    if (UncompressedChunkAddressesStat <= local_200) {
      local_4c0 = UncompressedChunkAddressesStat;
    }
    UncompressedChunkAddressesStat = local_4c0;
    local_70 = &DAT_003005d0;
    local_78 = &local_200;
    local_4c8 = local_200;
    if (local_200 <= DAT_003005d0) {
      local_4c8 = DAT_003005d0;
    }
    DAT_003005d0 = local_4c8;
    DAT_003005d8 = local_200 + DAT_003005d8;
    DAT_003005e0 = DAT_003005e0 + 1;
    DAT_003005e8 = local_200 * local_200 + DAT_003005e8;
    local_1e0 = (long *)(Ch.Idx + 0x250);
    local_210 = (double)((*(long *)(Ch.Idx + 0x268) - *local_1e0) +
                        (long)((*(int *)(Ch.Idx + 0x278) + 7) / 8));
    local_208 = &CompressedChunkAddressesStat;
    local_90 = &CompressedChunkAddressesStat;
    local_98 = &local_210;
    local_4e8 = local_210;
    if (CompressedChunkAddressesStat <= local_210) {
      local_4e8 = CompressedChunkAddressesStat;
    }
    CompressedChunkAddressesStat = local_4e8;
    local_60 = &DAT_003005f8;
    local_68 = &local_210;
    local_4f0 = local_210;
    if (local_210 <= DAT_003005f8) {
      local_4f0 = DAT_003005f8;
    }
    DAT_003005f8 = local_4f0;
    DAT_00300600 = local_210 + DAT_00300600;
    DAT_00300608 = DAT_00300608 + 1;
    DAT_00300610 = local_210 * local_210 + DAT_00300610;
    scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Write.cpp:369:5)>
    ::~scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Write_cpp:369:5)>
                    *)local_338);
    local_c0 = local_2c0;
    do {
      CmIt.Ht = (hash_table<unsigned_long,_idx2::chunk_meta_info> *)((long)&(CmIt.Ht)->Keys + 1);
    } while (*(char *)((long)&(CmIt.Ht)->Keys +
                      (long)&(((CmIt.Val)->Addrs).Buffer.Alloc)->_vptr_allocator) != '\x02');
    local_2c0 = (undefined1  [8])(((CmIt.Val)->Addrs).Buffer.Data + (long)CmIt.Ht * 8);
    phVar5 = (hash_table<unsigned_long,_idx2::chunk_meta_info> *)((long)CmIt.Ht * 0x60);
    CmIt.Key = (unsigned_long *)((long)&phVar5->Keys + ((CmIt.Val)->Addrs).Buffer.Bytes);
  }
  eVar7 = FlushChunks::anon_class_1_0_00000001::operator()(&local_3c1);
  auVar1 = eVar7._0_11_;
  eVar7._11_5_ = uStack_225;
  eVar7.Msg = (cstr)auVar1._0_8_;
  eVar7.Code = auVar1[8];
  eVar7.StackIdx = auVar1[9];
  eVar7.StrGened = (bool)auVar1[10];
  return eVar7;
}

Assistant:

error<idx2_err_code>
FlushChunks(const idx2_file& Idx2, encode_data* E)
{
#if VISUS_IDX2
  if (Idx2.external_write)
  {
    Reserve(&E->SortedChannels, Size(E->Channels));
    Clear(&E->SortedChannels);
    idx2_ForEach (Ch, E->Channels)
    {
      PushBack(&E->SortedChannels, t2<u32, channel*>{ *Ch.Key, Ch.Val });
    }
    InsertionSort(Begin(E->SortedChannels), End(E->SortedChannels));
    idx2_ForEach (Ch, E->SortedChannels)
    {
      i8 Level = GetLevelFromChannelKey(Ch->First);
      i8 Subband = GetSubbandFromChannelKey(Ch->First);
      i16 BitPlane = BitPlaneFromChannelKey(Ch->First);
      // printf("key %llu level %d subband %d bitplane %d\n", Ch->First, Level, Subband, BitPlane);
      WriteChunk(Idx2, E, Ch->Second, Level, Subband, BitPlane); //just call WriteChunk
    }
    return idx2_Error(idx2_err_code::NoError);
  }
#endif
  /* write the chunks */
  Reserve(&E->SortedChannels, Size(E->Channels));
  Clear(&E->SortedChannels);
  idx2_ForEach (Ch, E->Channels)
  {
    PushBack(&E->SortedChannels, t2<u32, channel*>{ *Ch.Key, Ch.Val });
  }
  InsertionSort(Begin(E->SortedChannels), End(E->SortedChannels));
  idx2_ForEach (Ch, E->SortedChannels)
  {
    i8 Level = GetLevelFromChannelKey(Ch->First);
    i8 Subband = GetSubbandFromChannelKey(Ch->First);
    i16 BitPlane = BitPlaneFromChannelKey(Ch->First);
    //printf("key %llu level %d subband %d bitplane %d\n", Ch->First, Level, Subband, BitPlane);
    WriteChunk(Idx2, E, Ch->Second, Level, Subband, BitPlane);
  }

  /* write the chunk metadata */
  idx2_ForEach (CmIt, E->ChunkMeta)
  {
    chunk_meta_info* Cm = CmIt.Val;
    file_id FileId = ConstructFilePath(Idx2, *CmIt.Key);
    if (FileId.Id != *CmIt.Key)
    {
      FileId = ConstructFilePath(Idx2, *CmIt.Key);
    }
    //printf("%llu %s\n", FileId.Id, FileId.Name.ConstPtr);
    idx2_Assert(FileId.Id == *CmIt.Key);
    /* compress and write chunk sizes */
    idx2_OpenMaybeExistingFile(Fp, FileId.Name.ConstPtr, "ab");
    Flush(&Cm->Sizes);
    WriteBuffer(Fp, ToBuffer(Cm->Sizes));
    ChunkSizesStat.Add((f64)Size(Cm->Sizes));
    WritePOD(Fp, (int)Size(Cm->Sizes));
    /* compress and write chunk addresses */
    CompressBufZstd(ToBuffer(Cm->Addrs), &E->CompressedChunkAddresses);
    WriteBuffer(Fp, ToBuffer(E->CompressedChunkAddresses));
    // write size of the compressed chunk addresses
    WritePOD(Fp, (int)Size(E->CompressedChunkAddresses));
    WritePOD(Fp, (int)Size(Cm->Addrs)); // number of chunks
    UncompressedChunkAddressesStat.Add((f64)Size(Cm->Addrs) * sizeof(Cm->Addrs[0]));
    CompressedChunkAddressesStat.Add((f64)Size(E->CompressedChunkAddresses));
  }

  return idx2_Error(idx2_err_code::NoError);
}